

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

int __thiscall helics::FederateState::getIntegerProperty(FederateState *this,int intProperty)

{
  int iVar1;
  
  switch(intProperty) {
  case 0x10f:
  case 0x110:
  case 0x112:
    return ((this->mLogManager)._M_t.
            super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>._M_t
            .super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>.
            super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->consoleLogLevel;
  case 0x111:
  case 0x113:
  case 0x115:
  case 0x116:
  case 0x117:
  case 0x118:
  case 0x119:
    goto switchD_002c85a7_caseD_111;
  case 0x114:
    return (int)(((this->mLogManager)._M_t.
                  super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                  .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->mLogBuffer).
                mMaxSize.super___atomic_base<unsigned_long>._M_i;
  case 0x11a:
    return this->indexGroup;
  default:
    if (intProperty == 0x102) {
      return (((this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->iteration).
             super___atomic_base<int>._M_i;
    }
switchD_002c85a7_caseD_111:
    iVar1 = TimeCoordinator::getIntegerProperty
                      ((this->timeCoord)._M_t.
                       super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                       .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
                       intProperty);
    return iVar1;
  }
}

Assistant:

int FederateState::getIntegerProperty(int intProperty) const
{
    switch (intProperty) {
        case defs::Properties::CURRENT_ITERATION:
            return timeCoord->getCurrentIteration();
        case defs::Properties::LOG_LEVEL:
        case defs::Properties::FILE_LOG_LEVEL:
        case defs::Properties::CONSOLE_LOG_LEVEL:
            return mLogManager->getConsoleLevel();
        case defs::Properties::LOG_BUFFER:
            return static_cast<int>(mLogManager->getLogBuffer().capacity());
        case defs::Properties::INDEX_GROUP:
            return indexGroup;
        default:
            return timeCoord->getIntegerProperty(intProperty);
    }
}